

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_image_resize_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,int new_width,int new_height,void *dst,
          rf_int dst_size,rf_allocator temp_allocator)

{
  uint uVar1;
  rf_source_location rVar2;
  rf_source_location rVar3;
  rf_allocator_args rVar4;
  bool bVar5;
  undefined1 auVar6 [24];
  rf_pixel_format output_h;
  int iVar7;
  long dst_size_00;
  rf_color *dst_00;
  int iVar8;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff00;
  int output_stride_in_bytes;
  int in_stack_ffffffffffffff08;
  int num_channels;
  uint uStack_94;
  uint uStack_64;
  
  if (image.valid == true) {
    uVar1 = image.format - RF_UNCOMPRESSED_GRAYSCALE;
    iVar8 = 0;
    if (uVar1 < 10) {
      iVar8 = *(int *)(&DAT_0017c058 + (ulong)uVar1 * 4);
    }
    if (new_height * new_width * iVar8 <= dst_size) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->width = 0;
      __return_storage_ptr__->height = 0;
      __return_storage_ptr__->format = 0;
      __return_storage_ptr__->valid = false;
      *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
      if (uVar1 < 2) {
        bVar5 = false;
        output_h = image.format;
      }
      else {
        if (image.format == RF_UNCOMPRESSED_R8G8B8A8) {
          output_h = RF_UNCOMPRESSED_R8G8B8;
        }
        else {
          if (image.format != RF_UNCOMPRESSED_R8G8B8) {
            bVar5 = true;
            output_h = 0;
            goto LAB_00129c31;
          }
          output_h = RF_UNCOMPRESSED_R5G6B5;
        }
        bVar5 = false;
      }
LAB_00129c31:
      if (bVar5) {
        iVar8 = image.height * image.width;
        dst_size_00 = (long)(iVar8 * 4);
        num_channels = 0x3e05;
        output_stride_in_bytes = 0x17cd9e;
        rVar2.proc_name._0_4_ = 0x17cd9e;
        rVar2.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar2.proc_name._4_4_ = 0;
        rVar2.line_in_file._0_4_ = 0x3e05;
        rVar2.line_in_file._4_4_ = 0;
        auVar6._8_8_ = (ulong)uStack_64 << 0x20;
        auVar6._0_8_ = dst_size_00;
        auVar6._16_8_ = 0;
        dst_00 = (rf_color *)
                 (*temp_allocator.allocator_proc)
                           (&temp_allocator,rVar2,RF_AM_ALLOC,(rf_allocator_args)(auVar6 << 0x40));
        if (dst_00 == (rf_color *)0x0) {
          rf_log_impl(8,0x17ca07,(char *)0x2,(long)iVar8 << 2);
          *(char **)(in_FS_OFFSET + -0x450) =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          *(char **)(in_FS_OFFSET + -0x448) = "rf_image_resize_to_buffer";
          *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3e19;
          *(undefined4 *)(in_FS_OFFSET + -0x438) = 2;
        }
        else {
          iVar7 = rf_bits_per_pixel(image.format);
          iVar7 = iVar7 * iVar8;
          iVar8 = iVar7 + 7;
          if (-1 < iVar7) {
            iVar8 = iVar7;
          }
          rf_format_pixels_to_rgba32(image.data,(long)(iVar8 >> 3),image.format,dst_00,dst_size_00);
          *(void **)(in_FS_OFFSET + -0x430) = temp_allocator.user_data;
          *(rf_allocator_proc **)(in_FS_OFFSET + -0x428) = temp_allocator.allocator_proc;
          stbir_resize_uint8((uchar *)dst_00,image.width,image.height,(int)dst,
                             (uchar *)(ulong)(uint)new_width,new_height,4,output_stride_in_bytes,
                             num_channels);
          *(undefined8 *)(in_FS_OFFSET + -0x430) = 0;
          *(undefined8 *)(in_FS_OFFSET + -0x428) = 0;
          rf_format_pixels(dst_00,dst_size_00,RF_UNCOMPRESSED_R8G8B8A8,dst,dst_size,image.format);
          __return_storage_ptr__->data = dst;
          __return_storage_ptr__->width = new_width;
          __return_storage_ptr__->height = new_height;
          __return_storage_ptr__->format = image.format;
          __return_storage_ptr__->valid = true;
        }
        rVar3.proc_name._0_4_ = 0x17cd9e;
        rVar3.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar3.proc_name._4_4_ = 0;
        rVar3.line_in_file._0_4_ = 0x3e1b;
        rVar3.line_in_file._4_4_ = 0;
        rVar4.size_to_allocate_or_reallocate = 0;
        rVar4.pointer_to_free_or_realloc = dst_00;
        rVar4._16_8_ = (ulong)uStack_94 << 0x20;
        (*temp_allocator.allocator_proc)(&temp_allocator,rVar3,RF_AM_FREE,rVar4);
        return __return_storage_ptr__;
      }
      *(void **)(in_FS_OFFSET + -0x430) = temp_allocator.user_data;
      *(rf_allocator_proc **)(in_FS_OFFSET + -0x428) = temp_allocator.allocator_proc;
      stbir_resize_uint8((uchar *)image.data,image.width,image.height,(int)dst,
                         (uchar *)(ulong)(uint)new_width,new_height,output_h,
                         in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
      *(undefined8 *)(in_FS_OFFSET + -0x430) = 0;
      *(undefined8 *)(in_FS_OFFSET + -0x428) = 0;
      __return_storage_ptr__->data = dst;
      __return_storage_ptr__->width = new_width;
      __return_storage_ptr__->height = new_height;
      __return_storage_ptr__->format = image.format;
      __return_storage_ptr__->valid = true;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_resize_to_buffer(rf_image image, int new_width, int new_height, void* dst, rf_int dst_size, rf_allocator temp_allocator)
{
    if (!image.valid || dst_size < new_width * new_height * rf_bytes_per_pixel(image.format)) return (rf_image){0};

    rf_image result = {0};

    int stb_format = rf_format_to_stb_channel_count(image.format);

    if (stb_format)
    {
        RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
        stbir_resize_uint8((unsigned char*) image.data, image.width, image.height, 0, (unsigned char*) dst, new_width, new_height, 0, stb_format);
        RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

        result.data   = dst;
        result.width  = new_width;
        result.height = new_height;
        result.format = image.format;
        result.valid  = true;
    }
    else // if the format of the image is not supported by stbir
    {
        int pixels_size = image.width * image.height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
        rf_color* pixels = RF_ALLOC(temp_allocator, pixels_size);

        if (pixels)
        {
            bool format_success = rf_format_pixels_to_rgba32(image.data, rf_image_size(image), image.format, pixels, pixels_size);
            RF_ASSERT(format_success);

            RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
            stbir_resize_uint8((unsigned char*)pixels, image.width, image.height, 0, (unsigned char*) dst, new_width, new_height, 0, 4);
            RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

            format_success = rf_format_pixels(pixels, pixels_size, RF_UNCOMPRESSED_R8G8B8A8, dst, dst_size, image.format);
            RF_ASSERT(format_success);

            result.data   = dst;
            result.width  = new_width;
            result.height = new_height;
            result.format = image.format;
            result.valid  = true;
        }
        else RF_LOG_ERROR(RF_BAD_ALLOC, "Allocation of size %d failed.", image.width * image.height * sizeof(rf_color));

        RF_FREE(temp_allocator, pixels);
    }

    return result;
}